

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceDefinition.cpp
# Opt level: O0

bool deqp::gles31::Functional::ProgramInterfaceDefinition::isTypeIntegerOrContainsIntegers
               (VarType *varType)

{
  bool bVar1;
  DataType DVar2;
  int iVar3;
  StructType *pSVar4;
  StructMember *this;
  VarType *pVVar5;
  bool local_1d;
  int local_1c;
  int ndx;
  VarType *varType_local;
  
  bVar1 = glu::VarType::isBasicType(varType);
  if (bVar1) {
    DVar2 = glu::VarType::getBasicType(varType);
    bVar1 = glu::isDataTypeIntOrIVec(DVar2);
    local_1d = true;
    if (!bVar1) {
      DVar2 = glu::VarType::getBasicType(varType);
      local_1d = glu::isDataTypeUintOrUVec(DVar2);
    }
    varType_local._7_1_ = local_1d;
  }
  else {
    bVar1 = glu::VarType::isArrayType(varType);
    if (bVar1) {
      pVVar5 = glu::VarType::getElementType(varType);
      varType_local._7_1_ = isTypeIntegerOrContainsIntegers(pVVar5);
    }
    else {
      bVar1 = glu::VarType::isStructType(varType);
      if (bVar1) {
        local_1c = 0;
        while( true ) {
          pSVar4 = glu::VarType::getStructPtr(varType);
          iVar3 = glu::StructType::getNumMembers(pSVar4);
          if (iVar3 <= local_1c) break;
          pSVar4 = glu::VarType::getStructPtr(varType);
          this = glu::StructType::getMember(pSVar4,local_1c);
          pVVar5 = glu::StructMember::getType(this);
          bVar1 = isTypeIntegerOrContainsIntegers(pVVar5);
          if (bVar1) {
            return true;
          }
          local_1c = local_1c + 1;
        }
        varType_local._7_1_ = false;
      }
      else {
        varType_local._7_1_ = true;
      }
    }
  }
  return varType_local._7_1_;
}

Assistant:

static bool isTypeIntegerOrContainsIntegers (const glu::VarType& varType)
{
	if (varType.isBasicType())
		return glu::isDataTypeIntOrIVec(varType.getBasicType()) || glu::isDataTypeUintOrUVec(varType.getBasicType());
	else if (varType.isArrayType())
		return isTypeIntegerOrContainsIntegers(varType.getElementType());
	else if (varType.isStructType())
	{
		for (int ndx = 0; ndx < varType.getStructPtr()->getNumMembers(); ++ndx)
			if (isTypeIntegerOrContainsIntegers(varType.getStructPtr()->getMember(ndx).getType()))
				return true;
		return false;
	}
	else
	{
		DE_ASSERT(false);
		return true;
	}
}